

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O1

bool __thiscall tinyusdz::value::TimeSamples::get_sample_at(TimeSamples *this,double t,Sample **dst)

{
  Sample *pSVar1;
  Sample *pSVar2;
  Sample *pSVar3;
  long lVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  if (dst == (Sample **)0x0) {
    return false;
  }
  if (this->_dirty == true) {
    update(this);
  }
  pSVar2 = (this->_samples).
           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->_samples).
           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = ((long)pSVar1 - (long)pSVar2 >> 3) * -0x3333333333333333 >> 2;
  pSVar3 = pSVar2;
  if (0 < lVar4) {
    dVar9 = ABS(t);
    pSVar3 = pSVar2 + lVar4 * 4;
    lVar4 = lVar4 + 1;
    pSVar2 = pSVar2 + 2;
    uVar5 = -(ulong)NAN(dVar9);
    do {
      dVar7 = ABS(t - pSVar2[-2].t);
      if (dVar7 <= 2.220446049250313e-16) {
LAB_002ba6ac:
        pSVar2 = pSVar2 + -2;
        goto LAB_002ba6bc;
      }
      dVar8 = ABS(pSVar2[-2].t);
      dVar6 = dVar8;
      if (dVar8 <= dVar9) {
        dVar6 = dVar9;
      }
      if (dVar7 <= (double)(~uVar5 & (ulong)dVar6 | uVar5 & (ulong)dVar8) * 2.220446049250313e-16)
      goto LAB_002ba6ac;
      dVar7 = ABS(t - pSVar2[-1].t);
      if (dVar7 <= 2.220446049250313e-16) {
LAB_002ba6b2:
        pSVar2 = pSVar2 + -1;
        goto LAB_002ba6bc;
      }
      dVar8 = ABS(pSVar2[-1].t);
      dVar6 = dVar8;
      if (dVar8 <= dVar9) {
        dVar6 = dVar9;
      }
      if (dVar7 <= (double)(~uVar5 & (ulong)dVar6 | uVar5 & (ulong)dVar8) * 2.220446049250313e-16)
      goto LAB_002ba6b2;
      dVar7 = ABS(t - pSVar2->t);
      if (dVar7 <= 2.220446049250313e-16) goto LAB_002ba6bc;
      dVar8 = ABS(pSVar2->t);
      dVar6 = dVar8;
      if (dVar8 <= dVar9) {
        dVar6 = dVar9;
      }
      if (dVar7 <= (double)(~uVar5 & (ulong)dVar6 | uVar5 & (ulong)dVar8) * 2.220446049250313e-16)
      goto LAB_002ba6bc;
      dVar7 = ABS(t - pSVar2[1].t);
      if (dVar7 <= 2.220446049250313e-16) {
LAB_002ba6b8:
        pSVar2 = pSVar2 + 1;
        goto LAB_002ba6bc;
      }
      dVar8 = ABS(pSVar2[1].t);
      dVar6 = dVar8;
      if (dVar8 <= dVar9) {
        dVar6 = dVar9;
      }
      if (dVar7 <= (double)(~uVar5 & (ulong)dVar6 | uVar5 & (ulong)dVar8) * 2.220446049250313e-16)
      goto LAB_002ba6b8;
      lVar4 = lVar4 + -1;
      pSVar2 = pSVar2 + 4;
    } while (1 < lVar4);
  }
  lVar4 = ((long)pSVar1 - (long)pSVar3 >> 3) * -0x3333333333333333;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      pSVar2 = pSVar1;
      if (lVar4 != 3) goto LAB_002ba6bc;
      dVar9 = ABS(t - pSVar3->t);
      pSVar2 = pSVar3;
      if (dVar9 <= 2.220446049250313e-16) goto LAB_002ba6bc;
      dVar8 = ABS(t);
      dVar6 = ABS(pSVar3->t);
      dVar7 = dVar6;
      if (dVar6 <= dVar8) {
        dVar7 = dVar8;
      }
      if (dVar9 <= (double)(~-(ulong)NAN(dVar8) & (ulong)dVar7 | -(ulong)NAN(dVar8) & (ulong)dVar6)
                   * 2.220446049250313e-16) goto LAB_002ba6bc;
      pSVar3 = pSVar3 + 1;
    }
    dVar9 = ABS(t - pSVar3->t);
    pSVar2 = pSVar3;
    if (dVar9 <= 2.220446049250313e-16) goto LAB_002ba6bc;
    dVar8 = ABS(t);
    dVar6 = ABS(pSVar3->t);
    dVar7 = dVar6;
    if (dVar6 <= dVar8) {
      dVar7 = dVar8;
    }
    if (dVar9 <= (double)(~-(ulong)NAN(dVar8) & (ulong)dVar7 | -(ulong)NAN(dVar8) & (ulong)dVar6) *
                 2.220446049250313e-16) goto LAB_002ba6bc;
    pSVar3 = pSVar3 + 1;
  }
  dVar9 = ABS(t - pSVar3->t);
  pSVar2 = pSVar3;
  if (2.220446049250313e-16 < dVar9) {
    dVar6 = ABS(t);
    dVar8 = ABS(pSVar3->t);
    dVar7 = dVar8;
    if (dVar8 <= dVar6) {
      dVar7 = dVar6;
    }
    if ((double)(~-(ulong)NAN(dVar6) & (ulong)dVar7 | -(ulong)NAN(dVar6) & (ulong)dVar8) *
        2.220446049250313e-16 < dVar9) {
      pSVar2 = pSVar1;
    }
  }
LAB_002ba6bc:
  if (pSVar2 != pSVar1) {
    *dst = pSVar2;
  }
  return false;
}

Assistant:

bool TimeSamples::get_sample_at(const double t, Sample **dst) {
  if (!dst) {
    return false;
  }

  if (_dirty) {
    update();
  }

  const auto it = std::find_if(_samples.begin(), _samples.end(), [&t](const Sample &sample) {
    return math::is_close(t, sample.t);
  });

  if (it != _samples.end()) {
    (*dst) = &(*it); 
  }
  return false;
}